

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O2

string * __thiscall
jbcoin::STTx::getMetaSQL
          (string *__return_storage_ptr__,STTx *this,uint32_t inLedger,string *escapedMetaData)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_58;
  Serializer s;
  
  Serializer::Serializer(&s,0x100);
  STObject::add(&this->super_STObject,&s);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&_Stack_58,&s.mData);
  getMetaSQL(__return_storage_ptr__,this,(Serializer *)&_Stack_58,inLedger,'V',escapedMetaData);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string STTx::getMetaSQL (std::uint32_t inLedger,
                                               std::string const& escapedMetaData) const
{
    Serializer s;
    add (s);
    return getMetaSQL (s, inLedger, TXN_SQL_VALIDATED, escapedMetaData);
}